

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O0

bool __thiscall
QNativeSocketEnginePrivate::setOption(QNativeSocketEnginePrivate *this,SocketOption opt,int v)

{
  uint uVar1;
  int iVar2;
  QNativeSocketEngine *pQVar3;
  ulong uVar4;
  SocketOption in_ESI;
  QNativeSocketEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  int flags;
  QNativeSocketEngine *q;
  int level;
  int n;
  bool local_15;
  int local_14;
  int local_10;
  undefined1 local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(in_RDI);
  uVar4 = (**(code **)(*(long *)&pQVar3->super_QAbstractSocketEngine + 0x78))();
  if ((uVar4 & 1) == 0) {
    local_15 = false;
  }
  else if (in_ESI == NonBlockingSocketOption) {
    uVar1 = fcntl((int)in_RDI->socketDescriptor,3,0);
    if (uVar1 == 0xffffffff) {
      local_15 = false;
    }
    else {
      iVar2 = fcntl((int)in_RDI->socketDescriptor,4,(ulong)(uVar1 | 0x800));
      if (iVar2 == -1) {
        local_15 = false;
      }
      else {
        local_15 = true;
      }
    }
  }
  else if (in_ESI == BindExclusively) {
    local_15 = true;
  }
  else if (in_ESI == MaxStreamsSocketOption) {
    local_15 = false;
  }
  else {
    local_10 = -0x55555556;
    local_14 = -0x55555556;
    convertToLevelAndOption
              (in_ESI,(in_RDI->super_QAbstractSocketEnginePrivate).socketProtocol,&local_14,
               &local_10);
    if (local_10 == -1) {
      local_15 = false;
    }
    else {
      iVar2 = setsockopt((int)in_RDI->socketDescriptor,local_14,local_10,local_c,4);
      local_15 = iVar2 == 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_15;
  }
  __stack_chk_fail();
}

Assistant:

bool QNativeSocketEnginePrivate::setOption(QNativeSocketEngine::SocketOption opt, int v)
{
    Q_Q(QNativeSocketEngine);
    if (!q->isValid())
        return false;

    // handle non-setsockopt and specific cases first
    switch (opt) {
    case QNativeSocketEngine::NonBlockingSocketOption: {
        // Make the socket nonblocking.
#if !defined(Q_OS_VXWORKS)
        int flags = ::fcntl(socketDescriptor, F_GETFL, 0);
        if (flags == -1) {
#ifdef QNATIVESOCKETENGINE_DEBUG
            perror("QNativeSocketEnginePrivate::setOption(): fcntl(F_GETFL) failed");
#endif
            return false;
        }
        if (::fcntl(socketDescriptor, F_SETFL, flags | O_NONBLOCK) == -1) {
#ifdef QNATIVESOCKETENGINE_DEBUG
            perror("QNativeSocketEnginePrivate::setOption(): fcntl(F_SETFL) failed");
#endif
            return false;
        }
#else // Q_OS_VXWORKS
        int onoff = 1;

        if (qt_safe_ioctl(socketDescriptor, FIONBIO, &onoff) < 0) {

#ifdef QNATIVESOCKETENGINE_DEBUG
            perror("QNativeSocketEnginePrivate::setOption(): ioctl(FIONBIO, 1) failed");
#endif
            return false;
        }
#endif // Q_OS_VXWORKS
        return true;
    }
    case QNativeSocketEngine::BindExclusively:
        return true;

    case QNativeSocketEngine::MaxStreamsSocketOption: {
#ifndef QT_NO_SCTP
        sctp_initmsg sctpInitMsg;
        QT_SOCKOPTLEN_T sctpInitMsgSize = sizeof(sctpInitMsg);
        if (::getsockopt(socketDescriptor, SOL_SCTP, SCTP_INITMSG, &sctpInitMsg,
                         &sctpInitMsgSize) == 0) {
            sctpInitMsg.sinit_num_ostreams = sctpInitMsg.sinit_max_instreams = uint16_t(v);
            return ::setsockopt(socketDescriptor, SOL_SCTP, SCTP_INITMSG, &sctpInitMsg,
                                sctpInitMsgSize) == 0;
        }
#endif
        return false;
    }

    default:
        break;
    }

    int n, level;
    convertToLevelAndOption(opt, socketProtocol, level, n);
#if defined(SO_REUSEPORT) && !defined(Q_OS_LINUX)
    if (opt == QNativeSocketEngine::AddressReusable) {
        // on OS X, SO_REUSEADDR isn't sufficient to allow multiple binds to the
        // same port (which is useful for multicast UDP). SO_REUSEPORT is, but
        // we most definitely do not want to use this for TCP. See QTBUG-6305.
        if (socketType == QAbstractSocket::UdpSocket)
            n = SO_REUSEPORT;
    }
#endif

    if (n == -1)
        return false;
    return ::setsockopt(socketDescriptor, level, n, (char *) &v, sizeof(v)) == 0;
}